

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fDepthStencilTests.cpp
# Opt level: O1

void deqp::gles2::Functional::DepthStencilCaseUtil::generateStencilVisualizeCommands
               (TestRenderTarget *target,
               vector<deqp::gles2::Functional::DepthStencilCaseUtil::RenderCommand,_std::allocator<deqp::gles2::Functional::DepthStencilCaseUtil::RenderCommand>_>
               *commands)

{
  long lVar1;
  int iVar2;
  int ndx;
  long lVar3;
  ulong uVar4;
  int stencilValues [16];
  value_type local_ec;
  int aiStack_78 [18];
  
  iVar2 = target->stencilBits;
  lVar3 = 0;
  do {
    aiStack_78[lVar3] = (int)lVar3;
    lVar3 = lVar3 + 1;
  } while (lVar3 != 8);
  uVar4 = 0xf00000000;
  lVar3 = 0;
  do {
    *(int *)((long)aiStack_78 + (uVar4 >> 0x1e)) = ~(-1 << ((byte)iVar2 & 0x1f)) + (int)lVar3;
    uVar4 = uVar4 - 0x100000000;
    lVar3 = lVar3 + -1;
  } while (lVar3 != -8);
  lVar3 = 0;
  do {
    local_ec.params.depthWriteMask = false;
    local_ec.params.depthFunc = 0;
    local_ec.params.depth = 0.0;
    local_ec.params.depthTestEnabled = false;
    local_ec.params.visibleFace = FACETYPE_FRONT;
    local_ec.rect.width = target->width;
    local_ec.rect.height = target->height;
    local_ec.rect.left = 0;
    local_ec.rect.bottom = 0;
    lVar1 = lVar3 + 1;
    local_ec.color.m_data._0_8_ = (ulong)(uint)((float)(int)lVar1 * 0.0625) << 0x20;
    local_ec.color.m_data[2] = 0.0;
    local_ec.color.m_data[3] = 0.0;
    local_ec.colorMask.m_data[0] = false;
    local_ec.colorMask.m_data[1] = true;
    local_ec.colorMask.m_data[2] = false;
    local_ec.colorMask.m_data[3] = false;
    local_ec.params.stencilTestEnabled = true;
    local_ec.params.stencil[1].reference = aiStack_78[lVar3];
    local_ec.params.stencil[0].reference = local_ec.params.stencil[1].reference;
    local_ec.params.stencil[0].function = 0x202;
    local_ec.params.stencil[0].compareMask = 0xffffffff;
    local_ec.params.stencil[0].stencilFailOp = 0x1e00;
    local_ec.params.stencil[0].depthFailOp = 0x1e00;
    local_ec.params.stencil[0].depthPassOp = 0x1e00;
    local_ec.params.stencil[0].writeMask = 0;
    local_ec.params.stencil[1].depthFailOp = 0x1e00;
    local_ec.params.stencil[1].depthPassOp._0_1_ = 0;
    local_ec.params.stencil[1]._21_7_ = 0x1e;
    local_ec.params.stencil[1].function = 0x202;
    local_ec.params.stencil[1].compareMask = 0xffffffff;
    local_ec.params.stencil[1].stencilFailOp = 0x1e00;
    std::
    vector<deqp::gles2::Functional::DepthStencilCaseUtil::RenderCommand,_std::allocator<deqp::gles2::Functional::DepthStencilCaseUtil::RenderCommand>_>
    ::push_back(commands,&local_ec);
    lVar3 = lVar1;
  } while (lVar1 != 0x10);
  return;
}

Assistant:

void generateStencilVisualizeCommands (const TestRenderTarget& target, vector<RenderCommand>& commands)
{
	const int	numValues		= 4*4;
	float		colorStep		= 1.0f / numValues; // 0 is reserved for non-matching.
	int			stencilValues[numValues];

	getStencilTestValues(target.stencilBits, numValues, &stencilValues[0]);

	for (int ndx = 0; ndx < numValues; ndx++)
	{
		RenderCommand cmd;

		cmd.params.visibleFace							= rr::FACETYPE_FRONT;
		cmd.rect										= rr::WindowRectangle(0, 0, target.width, target.height);
		cmd.color										= Vec4(0.0f, colorStep*float(ndx+1), 0.0f, 0.0f);
		cmd.colorMask									= tcu::BVec4(false, true, false, false);
		cmd.params.stencilTestEnabled					= true;

		cmd.params.stencil[rr::FACETYPE_FRONT].function			= GL_EQUAL;
		cmd.params.stencil[rr::FACETYPE_FRONT].reference		= stencilValues[ndx];
		cmd.params.stencil[rr::FACETYPE_FRONT].compareMask		= ~0u;
		cmd.params.stencil[rr::FACETYPE_FRONT].stencilFailOp	= GL_KEEP;
		cmd.params.stencil[rr::FACETYPE_FRONT].depthFailOp		= GL_KEEP;
		cmd.params.stencil[rr::FACETYPE_FRONT].depthPassOp		= GL_KEEP;
		cmd.params.stencil[rr::FACETYPE_FRONT].writeMask		= 0u;

		cmd.params.stencil[rr::FACETYPE_BACK] = cmd.params.stencil[rr::FACETYPE_FRONT];

		commands.push_back(cmd);
	}
}